

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer ppVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar7 = option::matches(&this->super_option,url,method);
  if (bVar7) {
    lVar8 = (long)this->select_[0];
    if (((lVar8 < 0) ||
        (ppVar5 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) <=
        this->select_[0])) || ((long)ppVar5[lVar8].first == -1)) {
      bVar6 = false;
      pcVar9 = (char *)0x0;
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar9 = (this->super_option).match_.begin_;
      pcVar10 = pcVar9 + ppVar5[lVar8].first;
      pcVar9 = pcVar9 + ppVar5[lVar8].second;
      bVar6 = true;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    if (bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar10,pcVar9);
    }
    else {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
    }
    lVar8 = (long)this->select_[1];
    if (((lVar8 < 0) ||
        (ppVar5 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) <=
        this->select_[1])) || ((long)ppVar5[lVar8].first == -1)) {
      pcVar9 = (char *)0x0;
      pcVar10 = (char *)0x0;
      bVar6 = false;
    }
    else {
      pcVar9 = (this->super_option).match_.begin_;
      pcVar10 = pcVar9 + ppVar5[lVar8].first;
      pcVar9 = pcVar9 + ppVar5[lVar8].second;
      bVar6 = true;
    }
    paVar4 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    if (bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar10,pcVar9);
    }
    else {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
    }
    lVar8 = (long)this->select_[2];
    if (((lVar8 < 0) ||
        (ppVar5 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) <=
        this->select_[2])) || ((long)ppVar5[lVar8].first == -1)) {
      pcVar10 = (char *)0x0;
      pcVar9 = (char *)0x0;
      bVar6 = false;
    }
    else {
      pcVar9 = (this->super_option).match_.begin_;
      pcVar10 = pcVar9 + ppVar5[lVar8].first;
      pcVar9 = pcVar9 + ppVar5[lVar8].second;
      bVar6 = true;
    }
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    if (bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar10,pcVar9);
    }
    else {
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    lVar8 = (long)this->select_[3];
    if (((lVar8 < 0) ||
        (ppVar5 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) <=
        this->select_[3])) || ((long)ppVar5[lVar8].first == -1)) {
      pcVar10 = (char *)0x0;
      pcVar9 = (char *)0x0;
      bVar6 = false;
    }
    else {
      pcVar9 = (this->super_option).match_.begin_;
      pcVar10 = pcVar9 + ppVar5[lVar8].first;
      pcVar9 = pcVar9 + ppVar5[lVar8].second;
      bVar6 = true;
    }
    paVar2 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    if (bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar10,pcVar9);
    }
    else {
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
    }
    lVar8 = (long)this->select_[4];
    if (((lVar8 < 0) ||
        (ppVar5 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) >> 3) <=
        this->select_[4])) || ((long)ppVar5[lVar8].first == -1)) {
      pcVar10 = (char *)0x0;
      pcVar9 = (char *)0x0;
      bVar6 = false;
    }
    else {
      pcVar9 = (this->super_option).match_.begin_;
      pcVar10 = pcVar9 + ppVar5[lVar8].first;
      pcVar9 = pcVar9 + ppVar5[lVar8].second;
      bVar6 = true;
    }
    paVar3 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar3;
    if (bVar6) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar10,pcVar9);
    }
    else {
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
    }
    if ((this->handle_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->handle_)._M_invoker)
              ((_Any_data *)&this->handle_,&local_d0,&local_50,&local_70,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar4) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  return bVar7;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}